

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void StartLockWheelingWindow(ImGuiWindow_conflict *window)

{
  ImGuiContext_conflict1 *pIVar1;
  
  pIVar1 = GImGui;
  if (GImGui->WheelingWindow != window) {
    GImGui->WheelingWindow = window;
    pIVar1->WheelingWindowRefMousePos = (pIVar1->IO).MousePos;
    pIVar1->WheelingWindowTimer = 2.0;
  }
  return;
}

Assistant:

static void StartLockWheelingWindow(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    if (g.WheelingWindow == window)
        return;
    g.WheelingWindow = window;
    g.WheelingWindowRefMousePos = g.IO.MousePos;
    g.WheelingWindowTimer = WINDOWS_MOUSE_WHEEL_SCROLL_LOCK_TIMER;
}